

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UBool insertRootBundle(UResourceDataEntry **t1,UErrorCode *status)

{
  UResourceDataEntry *pUVar1;
  UErrorCode parentStatus;
  UErrorCode local_1c;
  
  if (U_ZERO_ERROR < *status) {
    return '\0';
  }
  local_1c = U_ZERO_ERROR;
  pUVar1 = init_entry("root",(*t1)->fPath,&local_1c);
  if (local_1c < U_ILLEGAL_ARGUMENT_ERROR) {
    (*t1)->fParent = pUVar1;
    *t1 = pUVar1;
  }
  else {
    *status = local_1c;
  }
  return local_1c < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }